

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::ReadUntilEndOfLine(XFileParser *this)

{
  char *pcVar1;
  
  if (this->mIsBinaryFormat == false) {
    pcVar1 = this->mP;
    if (pcVar1 < this->mEnd) {
      do {
        if ((*pcVar1 == '\r') || (*pcVar1 == '\n')) {
          this->mP = pcVar1 + 1;
          this->mLineNumber = this->mLineNumber + 1;
          return;
        }
        pcVar1 = pcVar1 + 1;
        this->mP = pcVar1;
      } while (pcVar1 != this->mEnd);
    }
  }
  return;
}

Assistant:

void XFileParser::ReadUntilEndOfLine()
{
    if( mIsBinaryFormat)
        return;

    while( mP < mEnd)
    {
        if( *mP == '\n' || *mP == '\r')
        {
            ++mP; mLineNumber++;
            return;
        }

        ++mP;
    }
}